

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

void GA_Set_block_cyclic(int g_a,int *dims)

{
  long lVar1;
  Integer _ga_dims [7];
  Integer aIStack_48 [7];
  
  lVar1 = pnga_get_dimension((long)g_a);
  if (0 < lVar1) {
    do {
      aIStack_48[lVar1 + -1] = (long)*dims;
      dims = dims + 1;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  pnga_set_block_cyclic((long)g_a,aIStack_48);
  return;
}

Assistant:

void GA_Set_block_cyclic(int g_a, int dims[])
{
    Integer aa, ndim;
    Integer _ga_dims[MAXDIM];
    aa = (Integer)g_a;
    ndim = wnga_get_dimension(aa);
    COPYC2F(dims,_ga_dims, ndim);
    wnga_set_block_cyclic(aa, _ga_dims);
}